

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpreadwrite.c
# Opt level: O1

int http_SendMessage(SOCKINFO *info,int *TimeOut,char *fmt,...)

{
  char *buffer;
  bool bVar1;
  char in_AL;
  char cVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  void *__ptr;
  undefined8 *puVar6;
  ulong *puVar7;
  FILE *__stream;
  size_t sVar8;
  ulong uVar9;
  undefined8 in_RCX;
  size_t sVar10;
  char *pcVar11;
  undefined8 in_R8;
  char *buffer_00;
  undefined8 in_R9;
  size_t __n;
  size_t sVar12;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  int *local_130;
  va_list argp;
  char Chunk_Header [10];
  ulong local_e8 [4];
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  Chunk_Header[0] = '\0';
  Chunk_Header[1] = '\0';
  Chunk_Header[2] = '\0';
  Chunk_Header[3] = '\0';
  Chunk_Header[4] = '\0';
  Chunk_Header[5] = '\0';
  Chunk_Header[6] = '\0';
  Chunk_Header[7] = '\0';
  Chunk_Header[8] = '\0';
  Chunk_Header[9] = '\0';
  uVar5 = 0x18;
  argp[0].overflow_arg_area = &stack0x00000008;
  cVar2 = *fmt;
  local_e8[3] = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  if (cVar2 == '\0') {
    __ptr = (void *)0x0;
  }
  else {
    pcVar11 = fmt + 1;
    __n = 0x100000;
    local_130 = (int *)0x0;
    bVar1 = false;
    buffer_00 = (char *)0x0;
    sVar10 = 0;
    __ptr = (void *)0x0;
    do {
      if (bVar1 || cVar2 != 'I') {
        if (cVar2 == 'b') {
          uVar9 = (ulong)uVar5;
          if (uVar9 < 0x29) {
            uVar5 = uVar5 + 8;
            puVar6 = (undefined8 *)((long)local_e8 + uVar9);
          }
          else {
            puVar6 = (undefined8 *)argp[0].overflow_arg_area;
            argp[0].overflow_arg_area = (void *)((long)argp[0].overflow_arg_area + 8);
          }
          buffer = (char *)*puVar6;
          uVar9 = (ulong)uVar5;
          if (uVar9 < 0x29) {
            uVar5 = uVar5 + 8;
            puVar7 = (ulong *)((long)local_e8 + uVar9);
          }
          else {
            puVar7 = (ulong *)argp[0].overflow_arg_area;
            argp[0].overflow_arg_area = (void *)((long)argp[0].overflow_arg_area + 8);
          }
          uVar9 = *puVar7;
          if (uVar9 != 0) {
            iVar3 = sock_write(info,buffer,uVar9,TimeOut);
            iVar4 = 0;
            UpnpPrintf(UPNP_INFO,HTTP,".upnp/src/genlib/net/http/httpreadwrite.c",0x2c4,
                       ">>> (SENT) >>>\n%.*s\nbuf_length=%zd, num_written=%zd\n------------\n",
                       uVar9 & 0xffffffff,buffer,uVar9,(long)iVar3);
            if (uVar9 != (long)iVar3) goto LAB_0010e64b;
          }
        }
        else if (cVar2 == 'f') {
          if ((ulong)uVar5 < 0x29) {
            argp[0].overflow_arg_area = (void *)((long)local_e8 + (ulong)uVar5);
          }
          if ((local_130 == (int *)0x0) || (*local_130 == 0)) {
            __stream = fopen(*argp[0].overflow_arg_area,"rb");
          }
          else {
            __stream = (FILE *)(*virtualDirCallback.open)
                                         (*argp[0].overflow_arg_area,UPNP_READ,
                                          *(void **)(local_130 + 0x70),*(void **)(local_130 + 0x72))
            ;
          }
          if (__stream == (FILE *)0x0) {
            iVar4 = -0x1f7;
            goto LAB_0010e64b;
          }
          if ((local_130 != (int *)0x0) && (local_130[2] != 0)) {
            if (*local_130 == 0) {
              if (local_130[2] == 0) goto LAB_0010e75a;
              iVar3 = fseeko(__stream,*(__off_t *)(local_130 + 0x68),1);
            }
            else {
              iVar3 = (*virtualDirCallback.seek)
                                (__stream,*(off_t *)(local_130 + 0x68),1,
                                 *(void **)(local_130 + 0x70),*(void **)(local_130 + 0x72));
            }
            iVar4 = -0x1f7;
            if (iVar3 != 0) goto LAB_0010e95c;
          }
LAB_0010e75a:
          if (sVar10 != 0) {
            iVar3 = 0;
            goto LAB_0010e76a;
          }
          iVar4 = 0;
          goto LAB_0010e95c;
        }
      }
      else {
        uVar9 = (ulong)uVar5;
        if (uVar9 < 0x29) {
          uVar5 = uVar5 + 8;
          puVar6 = (undefined8 *)((long)local_e8 + uVar9);
        }
        else {
          puVar6 = (undefined8 *)argp[0].overflow_arg_area;
          argp[0].overflow_arg_area = (void *)((long)argp[0].overflow_arg_area + 8);
        }
        local_130 = (int *)*puVar6;
        sVar10 = *(size_t *)(local_130 + 0x6a);
        if ((long)*(size_t *)(local_130 + 0x6a) < 0) {
          sVar10 = __n;
        }
        if ((long)sVar10 < 0x100000) {
          __n = sVar10;
        }
        __ptr = malloc(__n + 0x14);
        if (__ptr == (void *)0x0) {
          iVar4 = -0x68;
          __ptr = (void *)0x0;
          goto LAB_0010e64b;
        }
        buffer_00 = (char *)((long)__ptr + 10);
        bVar1 = true;
      }
      cVar2 = *pcVar11;
      pcVar11 = pcVar11 + 1;
    } while (cVar2 != '\0');
  }
  iVar4 = 0;
  goto LAB_0010e64b;
  while( true ) {
    if ((local_130 == (int *)0x0) || (local_130[1] == 0)) {
      uVar5 = sock_write(info,buffer_00,sVar12,TimeOut);
      UpnpPrintf(UPNP_INFO,HTTP,".upnp/src/genlib/net/http/httpreadwrite.c",0x2a1,
                 ">>> (SENT) >>>\n%.*s\n------------\n",(ulong)uVar5,buffer_00);
      if (((int)uVar5 < 1) || (sVar12 != (long)(int)uVar5)) break;
    }
    else {
      (buffer_00 + sVar12)[0] = '\r';
      (buffer_00 + sVar12)[1] = '\n';
      Chunk_Header[8] = '\0';
      Chunk_Header[9] = '\0';
      Chunk_Header[0] = '\0';
      Chunk_Header[1] = '\0';
      Chunk_Header[2] = '\0';
      Chunk_Header[3] = '\0';
      Chunk_Header[4] = '\0';
      Chunk_Header[5] = '\0';
      Chunk_Header[6] = '\0';
      Chunk_Header[7] = '\0';
      uVar5 = snprintf(Chunk_Header,10,"%zx\r\n",sVar12);
      uVar9 = (ulong)uVar5;
      cVar2 = '\x05';
      if (uVar5 < 10) {
        sVar8 = strlen(Chunk_Header);
        memcpy(buffer_00 + -sVar8,Chunk_Header,sVar8);
        sVar8 = strlen(Chunk_Header);
        uVar5 = sock_write(info,buffer_00 + -sVar8,sVar12 + sVar8 + 2,TimeOut);
        uVar9 = (ulong)uVar5;
        if ((int)uVar5 < 1) {
          cVar2 = '\x05';
        }
        else {
          sVar8 = strlen(Chunk_Header);
          uVar9 = sVar8 + sVar12 + 2;
          cVar2 = (uVar9 != uVar5) * '\x05';
        }
      }
      else {
        iVar3 = -0x38f;
      }
      if (cVar2 != '\0') {
        iVar4 = iVar3;
        if (cVar2 != '\x05') {
          return (int)uVar9;
        }
        break;
      }
    }
    iVar4 = iVar3;
    if (sVar10 == 0) break;
LAB_0010e76a:
    if (local_130 == (int *)0x0) {
      sVar12 = fread(buffer_00,1,__n,__stream);
    }
    else {
      sVar12 = sVar10;
      if ((long)__n <= (long)sVar10) {
        sVar12 = __n;
      }
      if (*local_130 == 0) {
        sVar12 = fread(buffer_00,1,sVar12,__stream);
      }
      else {
        iVar4 = (*virtualDirCallback.read)
                          (__stream,buffer_00,sVar12,*(void **)(local_130 + 0x70),
                           *(void **)(local_130 + 0x72));
        sVar12 = (size_t)iVar4;
      }
      sVar10 = sVar10 - sVar12;
      if (*(long *)(local_130 + 0x6a) < 0) {
        sVar10 = __n;
      }
    }
    iVar4 = iVar3;
    if (sVar12 == 0) {
      iVar4 = -0x1f7;
      if ((local_130 != (int *)0x0) && (local_130[1] != 0)) {
        sock_write(info,"0\r\n\r\n",5,TimeOut);
        iVar4 = iVar3;
      }
      break;
    }
  }
LAB_0010e95c:
  if ((local_130 == (int *)0x0) || (*local_130 == 0)) {
    fclose(__stream);
  }
  else {
    (*virtualDirCallback.close)(__stream,*(void **)(local_130 + 0x70),*(void **)(local_130 + 0x72));
  }
LAB_0010e64b:
  free(__ptr);
  return iVar4;
}

Assistant:

int http_SendMessage(SOCKINFO *info, int *TimeOut, const char *fmt, ...)
{
#if EXCLUDE_WEB_SERVER == 0
	FILE *Fp;
	struct SendInstruction *Instr = NULL;
	char *filename = NULL;
	char *file_buf = NULL;
	char *ChunkBuf = NULL;
	/* 10 byte allocated for chunk header. */
	char Chunk_Header[CHUNK_HEADER_SIZE];
	size_t num_read;
	off_t amount_to_be_read = 0;
	size_t Data_Buf_Size = WEB_SERVER_BUF_SIZE;
#endif /* EXCLUDE_WEB_SERVER */
	va_list argp;
	char *buf = NULL;
	char c;
	int nw;
	int RetVal = 0;
	size_t buf_length;
	size_t num_written;
	int I_fmt_processed = 0;

#if EXCLUDE_WEB_SERVER == 0
	memset(Chunk_Header, 0, sizeof(Chunk_Header));
#endif /* EXCLUDE_WEB_SERVER */
	va_start(argp, fmt);
	while ((c = *fmt++)) {
#if EXCLUDE_WEB_SERVER == 0
		if (c == 'I' && !I_fmt_processed) {
			I_fmt_processed = 1;
			Instr = va_arg(argp, struct SendInstruction *);
			if (Instr->ReadSendSize >= 0)
				amount_to_be_read = Instr->ReadSendSize;
			else
				amount_to_be_read = (off_t)Data_Buf_Size;
			if (amount_to_be_read < (off_t)WEB_SERVER_BUF_SIZE)
				Data_Buf_Size = (size_t)amount_to_be_read;
			ChunkBuf = malloc(
				(size_t)(Data_Buf_Size + CHUNK_HEADER_SIZE +
					 CHUNK_TAIL_SIZE));
			if (!ChunkBuf) {
				RetVal = UPNP_E_OUTOF_MEMORY;
				goto ExitFunction;
			}
			file_buf = ChunkBuf + CHUNK_HEADER_SIZE;
		} else if (c == 'f') {
			/* file name */
			filename = va_arg(argp, char *);
			if (Instr && Instr->IsVirtualFile)
				Fp = (virtualDirCallback.open)(filename,
					UPNP_READ,
					Instr->Cookie,
					Instr->RequestCookie);
			else
	#ifdef _WIN32
				fopen_s(&Fp, filename, "rb");
	#else
				Fp = fopen(filename, "rb");
	#endif
			if (Fp == NULL) {
				RetVal = UPNP_E_FILE_READ_ERROR;
				goto ExitFunction;
			}
			if (Instr && Instr->IsRangeActive &&
				Instr->IsVirtualFile) {
				if (virtualDirCallback.seek(Fp,
					    Instr->RangeOffset,
					    SEEK_CUR,
					    Instr->Cookie,
					    Instr->RequestCookie) != 0) {
					RetVal = UPNP_E_FILE_READ_ERROR;
					goto Cleanup_File;
				}
			} else if (Instr && Instr->IsRangeActive) {
				if (fseeko(Fp, Instr->RangeOffset, SEEK_CUR) !=
					0) {
					RetVal = UPNP_E_FILE_READ_ERROR;
					goto Cleanup_File;
				}
			}
			while (amount_to_be_read) {
				if (Instr) {
					int nr;
					size_t n =
						amount_to_be_read >=
								(off_t)Data_Buf_Size
							? Data_Buf_Size
							: (size_t)amount_to_be_read;
					if (Instr->IsVirtualFile) {
						nr = virtualDirCallback.read(Fp,
							file_buf,
							n,
							Instr->Cookie,
							Instr->RequestCookie);
						num_read = (size_t)nr;
					} else {
						num_read = fread(file_buf,
							(size_t)1,
							n,
							Fp);
					}
					amount_to_be_read -= (off_t)num_read;
					if (Instr->ReadSendSize < 0) {
						/* read until close */
						amount_to_be_read =
							(off_t)Data_Buf_Size;
					}
				} else {
					num_read = fread(file_buf,
						(size_t)1,
						Data_Buf_Size,
						Fp);
				}
				if (num_read == (size_t)0) {
					/* EOF so no more to send. */
					if (Instr && Instr->IsChunkActive) {
						const char *str = "0\r\n\r\n";
						nw = sock_write(info,
							str,
							strlen(str),
							TimeOut);
					} else {
						RetVal = UPNP_E_FILE_READ_ERROR;
					}
					goto Cleanup_File;
				}
				/* Create chunk for the current buffer. */
				if (Instr && Instr->IsChunkActive) {
					int rc;
					/* Copy CRLF at the end of the chunk */
					memcpy(file_buf + num_read,
						"\r\n",
						(size_t)2);
					/* Hex length for the chunk size. */
					memset(Chunk_Header,
						0,
						sizeof(Chunk_Header));
					rc = snprintf(Chunk_Header,
						sizeof(Chunk_Header),
						"%" PRIzx "\r\n",
						num_read);
					if (rc < 0 ||
						(unsigned int)rc >=
							sizeof(Chunk_Header)) {
						RetVal = UPNP_E_INTERNAL_ERROR;
						goto Cleanup_File;
					}
					/* Copy the chunk size header  */
					memcpy(file_buf - strlen(Chunk_Header),
						Chunk_Header,
						strlen(Chunk_Header));
					/* on the top of the buffer. */
					/*file_buf[num_read+strlen(Chunk_Header)]
					 * = NULL; */
					/*upnpprintf("Sending
					 * %s\n",file_buf-strlen(Chunk_Header));*/
					nw = sock_write(info,
						file_buf - strlen(Chunk_Header),
						num_read +
							strlen(Chunk_Header) +
							(size_t)2,
						TimeOut);
					num_written = (size_t)nw;
					if (nw <= 0 ||
						num_written !=
							num_read +
								strlen(Chunk_Header) +
								(size_t)2)
						/* Send error nothing we can do.
						 */
						goto Cleanup_File;
				} else {
					/* write data */
					nw = sock_write(info,
						file_buf,
						num_read,
						TimeOut);
					UpnpPrintf(UPNP_INFO,
						HTTP,
						__FILE__,
						__LINE__,
						">>> (SENT) "
						">>>\n%.*s\n------------\n",
						nw,
						file_buf);
					/* Send error nothing we can do */
					num_written = (size_t)nw;
					if (nw <= 0 ||
						num_written != num_read) {
						goto Cleanup_File;
					}
				}
			} /* while */
		Cleanup_File:
			if (Instr && Instr->IsVirtualFile) {
				virtualDirCallback.close(Fp,
					Instr->Cookie,
					Instr->RequestCookie);
			} else {
				fclose(Fp);
			}
			goto ExitFunction;
		} else
#endif /* EXCLUDE_WEB_SERVER */
			if (c == 'b') {
				/* memory buffer */
				buf = va_arg(argp, char *);
				buf_length = va_arg(argp, size_t);
				if (buf_length > (size_t)0) {
					nw = sock_write(
						info, buf, buf_length, TimeOut);
					num_written = (size_t)nw;
					UpnpPrintf(UPNP_INFO,
						HTTP,
						__FILE__,
						__LINE__,
						">>> (SENT) >>>\n"
						"%.*s\nbuf_length=%" PRIzd
						", num_written=%" PRIzd "\n"
						"------------\n",
						(int)buf_length,
						buf,
						buf_length,
						num_written);
					if (num_written != buf_length) {
						RetVal = 0;
						goto ExitFunction;
					}
				}
			}
	}

ExitFunction:
	va_end(argp);
#if EXCLUDE_WEB_SERVER == 0
	free(ChunkBuf);
#endif /* EXCLUDE_WEB_SERVER */
	return RetVal;
}